

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O3

ncnn_modelbin_t ncnn_modelbin_create_from_datareader(ncnn_datareader_t dr)

{
  ncnn_modelbin_t p_Var1;
  ModelBinFromDataReader *this;
  
  p_Var1 = (ncnn_modelbin_t)malloc(0x20);
  this = (ModelBinFromDataReader *)operator_new(0x18);
  ncnn::ModelBinFromDataReader::ModelBinFromDataReader(this,(DataReader *)dr->pthis);
  (this->super_ModelBin)._vptr_ModelBin = (_func_int **)&PTR__ModelBinFromDataReader_0034ebc0;
  this[1].super_ModelBin._vptr_ModelBin = (_func_int **)p_Var1;
  p_Var1->pthis = this;
  p_Var1->load_1d = __ncnn_ModelBinFromDataReader_load_1d;
  p_Var1->load_2d = __ncnn_ModelBinFromDataReader_load_2d;
  p_Var1->load_3d = __ncnn_ModelBinFromDataReader_load_3d;
  return p_Var1;
}

Assistant:

ncnn_modelbin_t ncnn_modelbin_create_from_datareader(const ncnn_datareader_t dr)
{
    ncnn_modelbin_t mb = (ncnn_modelbin_t)malloc(sizeof(struct __ncnn_modelbin_t));
    mb->pthis = (void*)(new ModelBinFromDataReader_c_api(mb, *(const DataReader*)dr->pthis));
    mb->load_1d = __ncnn_ModelBinFromDataReader_load_1d;
    mb->load_2d = __ncnn_ModelBinFromDataReader_load_2d;
    mb->load_3d = __ncnn_ModelBinFromDataReader_load_3d;
    return mb;
}